

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuickSort.h
# Opt level: O2

void JsUtil::
     QuickSort<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>,_int_(*)(void_*,_const_void_*,_const_void_*)>
     ::Sort(WriteBarrierPtr<void> *base,size_t nmemb,size_t size,
           _func_int_void_ptr_void_ptr_void_ptr *comparer,void *context)

{
  int iVar1;
  ulong uVar2;
  WriteBarrierPtr<void> *pWVar3;
  WriteBarrierPtr<void> *pWVar4;
  WriteBarrierPtr<void> *pWVar5;
  WriteBarrierPtr<void> *b;
  WriteBarrierPtr<void> *pWVar6;
  WriteBarrierPtr<void> *pWVar7;
  ulong uVar8;
  size_t nmemb_00;
  WriteBarrierPtr<void> *pWVar9;
  WriteBarrierPtr<void> *pWVar10;
  ulong uVar11;
  
LAB_009d713e:
  if (base != (WriteBarrierPtr<void> *)0x0) {
    if (9 < nmemb) goto code_r0x009d7155;
    if (nmemb - 2 < 8) {
      pWVar7 = base + size;
      switch(nmemb) {
      case 2:
        goto LAB_009d7be9;
      case 3:
        iVar1 = (*comparer)(context,pWVar7,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (base,pWVar7,size);
        }
        iVar1 = (*comparer)(context,base + size * 2,pWVar7);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar7,base + size * 2,size);
        }
LAB_009d7be9:
        iVar1 = (*comparer)(context,pWVar7,base);
        pWVar3 = base;
        pWVar10 = pWVar7;
        break;
      case 4:
        iVar1 = (*comparer)(context,pWVar7,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (base,pWVar7,size);
        }
        pWVar3 = base + size * 3;
        pWVar10 = base + size * 2;
        iVar1 = (*comparer)(context,pWVar3,pWVar10);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar10,pWVar3,size);
        }
        iVar1 = (*comparer)(context,pWVar10,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (base,pWVar10,size);
        }
        iVar1 = (*comparer)(context,pWVar3,pWVar7);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar7,pWVar3,size);
        }
        iVar1 = (*comparer)(context,pWVar10,pWVar7);
        pWVar3 = pWVar7;
        break;
      case 5:
        iVar1 = (*comparer)(context,pWVar7,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (base,pWVar7,size);
        }
        pWVar6 = base + size * 4;
        pWVar3 = base + size * 3;
        iVar1 = (*comparer)(context,pWVar6,pWVar3);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar3,pWVar6,size);
        }
        pWVar10 = base + size * 2;
        iVar1 = (*comparer)(context,pWVar6,pWVar10);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar10,pWVar6,size);
        }
        iVar1 = (*comparer)(context,pWVar3,pWVar10);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar10,pWVar3,size);
        }
        iVar1 = (*comparer)(context,pWVar3,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (base,pWVar3,size);
        }
        iVar1 = (*comparer)(context,pWVar10,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (base,pWVar10,size);
        }
        iVar1 = (*comparer)(context,pWVar6,pWVar7);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar7,pWVar6,size);
        }
        iVar1 = (*comparer)(context,pWVar3,pWVar7);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar7,pWVar3,size);
        }
        goto LAB_009d7b81;
      case 6:
        pWVar3 = base + size * 2;
        iVar1 = (*comparer)(context,pWVar3,pWVar7);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar7,pWVar3,size);
        }
        iVar1 = (*comparer)(context,pWVar3,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (base,pWVar3,size);
        }
        iVar1 = (*comparer)(context,pWVar7,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (base,pWVar7,size);
        }
        pWVar9 = base + size * 5;
        pWVar6 = base + size * 4;
        iVar1 = (*comparer)(context,pWVar9,pWVar6);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar6,pWVar9,size);
        }
        pWVar10 = base + size * 3;
        iVar1 = (*comparer)(context,pWVar9,pWVar10);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar10,pWVar9,size);
        }
        iVar1 = (*comparer)(context,pWVar6,pWVar10);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar10,pWVar6,size);
        }
        iVar1 = (*comparer)(context,pWVar10,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (base,pWVar10,size);
        }
        iVar1 = (*comparer)(context,pWVar6,pWVar7);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar7,pWVar6,size);
        }
        iVar1 = (*comparer)(context,pWVar9,pWVar3);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar3,pWVar9,size);
        }
        iVar1 = (*comparer)(context,pWVar6,pWVar3);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar3,pWVar6,size);
        }
        iVar1 = (*comparer)(context,pWVar10,pWVar7);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar7,pWVar10,size);
        }
        iVar1 = (*comparer)(context,pWVar10,pWVar3);
        break;
      case 7:
        pWVar3 = base + size * 2;
        iVar1 = (*comparer)(context,pWVar3,pWVar7);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar7,pWVar3,size);
        }
        iVar1 = (*comparer)(context,pWVar3,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (base,pWVar3,size);
        }
        iVar1 = (*comparer)(context,pWVar7,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (base,pWVar7,size);
        }
        pWVar6 = base + size * 4;
        pWVar10 = base + size * 3;
        iVar1 = (*comparer)(context,pWVar6,pWVar10);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar10,pWVar6,size);
        }
        pWVar4 = base + size * 6;
        pWVar9 = base + size * 5;
        iVar1 = (*comparer)(context,pWVar4,pWVar9);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar9,pWVar4,size);
        }
        iVar1 = (*comparer)(context,pWVar9,pWVar10);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar10,pWVar9,size);
        }
        iVar1 = (*comparer)(context,pWVar4,pWVar6);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar6,pWVar4,size);
        }
        iVar1 = (*comparer)(context,pWVar9,pWVar6);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar6,pWVar9,size);
        }
        iVar1 = (*comparer)(context,pWVar6,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (base,pWVar6,size);
        }
        iVar1 = (*comparer)(context,pWVar10,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (base,pWVar10,size);
        }
        iVar1 = (*comparer)(context,pWVar9,pWVar7);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar7,pWVar9,size);
        }
        iVar1 = (*comparer)(context,pWVar4,pWVar3);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar3,pWVar4,size);
        }
        iVar1 = (*comparer)(context,pWVar9,pWVar3);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar3,pWVar9,size);
        }
        iVar1 = (*comparer)(context,pWVar10,pWVar7);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar7,pWVar10,size);
        }
        iVar1 = (*comparer)(context,pWVar6,pWVar3);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar3,pWVar6,size);
        }
        iVar1 = (*comparer)(context,pWVar10,pWVar3);
        break;
      case 8:
        iVar1 = (*comparer)(context,pWVar7,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (base,pWVar7,size);
        }
        pWVar3 = base + size * 3;
        pWVar6 = base + size * 2;
        iVar1 = (*comparer)(context,pWVar3,pWVar6);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar6,pWVar3,size);
        }
        iVar1 = (*comparer)(context,pWVar6,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (base,pWVar6,size);
        }
        iVar1 = (*comparer)(context,pWVar3,pWVar7);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar7,pWVar3,size);
        }
        iVar1 = (*comparer)(context,pWVar6,pWVar7);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar7,pWVar6,size);
        }
        pWVar9 = base + size * 5;
        pWVar10 = base + size * 4;
        iVar1 = (*comparer)(context,pWVar9,pWVar10);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar10,pWVar9,size);
        }
        pWVar4 = base + size * 7;
        pWVar5 = base + size * 6;
        iVar1 = (*comparer)(context,pWVar4,pWVar5);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar5,pWVar4,size);
        }
        iVar1 = (*comparer)(context,pWVar5,pWVar10);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar10,pWVar5,size);
        }
        iVar1 = (*comparer)(context,pWVar4,pWVar9);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar9,pWVar4,size);
        }
        iVar1 = (*comparer)(context,pWVar5,pWVar9);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar9,pWVar5,size);
        }
        iVar1 = (*comparer)(context,pWVar10,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (base,pWVar10,size);
        }
        iVar1 = (*comparer)(context,pWVar9,pWVar7);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar7,pWVar9,size);
        }
        iVar1 = (*comparer)(context,pWVar10,pWVar7);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar7,pWVar10,size);
        }
        iVar1 = (*comparer)(context,pWVar5,pWVar6);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar6,pWVar5,size);
        }
        iVar1 = (*comparer)(context,pWVar4,pWVar3);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar3,pWVar4,size);
        }
        iVar1 = (*comparer)(context,pWVar5,pWVar3);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar3,pWVar5,size);
        }
        iVar1 = (*comparer)(context,pWVar10,pWVar6);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar6,pWVar10,size);
        }
        iVar1 = (*comparer)(context,pWVar9,pWVar3);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar3,pWVar9,size);
        }
        iVar1 = (*comparer)(context,pWVar10,pWVar3);
        break;
      case 9:
        iVar1 = (*comparer)(context,pWVar7,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (base,pWVar7,size);
        }
        pWVar6 = base + size * 4;
        pWVar3 = base + size * 3;
        iVar1 = (*comparer)(context,pWVar6,pWVar3);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar3,pWVar6,size);
        }
        pWVar9 = base + size * 7;
        pWVar10 = base + size * 6;
        iVar1 = (*comparer)(context,pWVar9,pWVar10);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar10,pWVar9,size);
        }
        pWVar4 = base + size * 2;
        iVar1 = (*comparer)(context,pWVar4,pWVar7);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar7,pWVar4,size);
        }
        pWVar5 = base + size * 5;
        iVar1 = (*comparer)(context,pWVar5,pWVar6);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar6,pWVar5,size);
        }
        b = base + size * 8;
        iVar1 = (*comparer)(context,b,pWVar9);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar9,b,size);
        }
        iVar1 = (*comparer)(context,pWVar7,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (base,pWVar7,size);
        }
        iVar1 = (*comparer)(context,pWVar6,pWVar3);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar3,pWVar6,size);
        }
        iVar1 = (*comparer)(context,pWVar9,pWVar10);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar10,pWVar9,size);
        }
        iVar1 = (*comparer)(context,pWVar3,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (base,pWVar3,size);
        }
        iVar1 = (*comparer)(context,pWVar10,pWVar3);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar3,pWVar10,size);
        }
        iVar1 = (*comparer)(context,pWVar3,base);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (base,pWVar3,size);
        }
        iVar1 = (*comparer)(context,pWVar6,pWVar7);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar7,pWVar6,size);
        }
        iVar1 = (*comparer)(context,pWVar9,pWVar6);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar6,pWVar9,size);
        }
        iVar1 = (*comparer)(context,pWVar6,pWVar7);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar7,pWVar6,size);
        }
        iVar1 = (*comparer)(context,pWVar5,pWVar4);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar4,pWVar5,size);
        }
        iVar1 = (*comparer)(context,b,pWVar5);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar5,b,size);
        }
        iVar1 = (*comparer)(context,pWVar5,pWVar4);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar4,pWVar5,size);
        }
        iVar1 = (*comparer)(context,pWVar3,pWVar7);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar7,pWVar3,size);
        }
        iVar1 = (*comparer)(context,pWVar9,pWVar5);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar5,pWVar9,size);
        }
        iVar1 = (*comparer)(context,pWVar10,pWVar4);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar4,pWVar10,size);
        }
        iVar1 = (*comparer)(context,pWVar10,pWVar6);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar6,pWVar10,size);
        }
        iVar1 = (*comparer)(context,pWVar6,pWVar4);
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar4,pWVar6,size);
        }
        iVar1 = (*comparer)(context,pWVar3,pWVar4);
        pWVar7 = pWVar5;
        if (iVar1 < 0) {
          QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                    (pWVar4,pWVar3,size);
        }
LAB_009d7b81:
        iVar1 = (*comparer)(context,pWVar10,pWVar7);
        pWVar3 = pWVar7;
      }
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar3,pWVar10,size);
        return;
      }
    }
  }
  return;
code_r0x009d7155:
  pWVar7 = base + (nmemb >> 2) * size;
  iVar1 = (*comparer)(context,pWVar7,base);
  if (iVar1 < 0) {
    QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
              (base,pWVar7,size);
  }
  uVar2 = (nmemb - 1) * size;
  pWVar6 = base + uVar2;
  pWVar3 = base + (nmemb * 3 >> 2) * size;
  iVar1 = (*comparer)(context,pWVar6,pWVar3);
  if (iVar1 < 0) {
    QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
              (pWVar3,pWVar6,size);
  }
  uVar8 = (nmemb >> 1) * size;
  pWVar10 = base + uVar8;
  iVar1 = (*comparer)(context,pWVar6,pWVar10);
  if (iVar1 < 0) {
    QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
              (pWVar10,pWVar6,size);
  }
  iVar1 = (*comparer)(context,pWVar3,pWVar10);
  if (iVar1 < 0) {
    QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
              (pWVar10,pWVar3,size);
  }
  iVar1 = (*comparer)(context,pWVar3,base);
  if (iVar1 < 0) {
    QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
              (base,pWVar3,size);
  }
  iVar1 = (*comparer)(context,pWVar10,base);
  if (iVar1 < 0) {
    QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
              (base,pWVar10,size);
  }
  iVar1 = (*comparer)(context,pWVar6,pWVar7);
  if (iVar1 < 0) {
    QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
              (pWVar7,pWVar6,size);
  }
  iVar1 = (*comparer)(context,pWVar3,pWVar7);
  if (iVar1 < 0) {
    QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
              (pWVar7,pWVar3,size);
  }
  iVar1 = (*comparer)(context,pWVar10,pWVar7);
  if (iVar1 < 0) {
    QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
              (pWVar7,pWVar10,size);
  }
  QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
            (pWVar6,pWVar10,size);
  nmemb_00 = 0;
  pWVar7 = base;
  for (uVar11 = 0; uVar11 < uVar8; uVar11 = uVar11 + size) {
    iVar1 = (*comparer)(context,pWVar7,pWVar6);
    if (iVar1 < 1) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar7,base + nmemb_00 * size,size);
      nmemb_00 = nmemb_00 + 1;
    }
    pWVar7 = pWVar7 + size;
  }
  for (; uVar11 < uVar2; uVar11 = uVar11 + size) {
    iVar1 = (*comparer)(context,pWVar7,pWVar6);
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (pWVar7,base + nmemb_00 * size,size);
      nmemb_00 = nmemb_00 + 1;
    }
    pWVar7 = pWVar7 + size;
  }
  QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
            (base + nmemb_00 * size,pWVar6,size);
  Sort(base,nmemb_00,size,comparer,context);
  nmemb = nmemb - (nmemb_00 + 1);
  base = base + (nmemb_00 + 1) * size;
  goto LAB_009d713e;
}

Assistant:

static void Sort(T* base, size_t nmemb, size_t size, Comparer comparer, void* context)
        {
            if (!base)
            {
                return;
            }

            if (nmemb <= 9) // use sorting networks for members <= 2^3
            {
                switch(nmemb)
                {
                    case 9:
                        CCQ_SORT9()
                        break;
                    case 8:
                        CCQ_SORT8()
                        break;
                    case 7:
                        CCQ_SORT7()
                        break;
                    case 6:
                        CCQ_SORT6()
                        break;
                    case 5:
                        CCQ_SORT5(0, 1, 2, 3, 4)
                        break;
                    case 4:
                        CCQ_SORT4()
                        break;
                    case 3:
                        CCQ_SORT3()
                        break;
                    case 2:
                        CCQ_SORT2(0, 1)
                        break;
                    default:
                        break; // nothing to sort
                }

                return;
            }

            CCQ_SORT5(0, (nmemb / 4), (nmemb / 2), ((3 * nmemb) / 4), (nmemb - 1));
            // guess the median is in the middle now.
            size_t pos = 0;
            const size_t pivot = (nmemb - 1) * size;
            // make last element the median(pivot)
            CCQ_SWAP(base + pivot, base + ((nmemb / 2) * size), size);

            // standard qsort pt. below
            size_t i = 0;
            for (; i < nmemb / 2 * size; i+= size)
            {
                // During the first half, count equal values as below the pivot
                if (comparer(context, base + i, base + pivot) <= 0)
                {
                    CCQ_SWAP(base + i, base + (pos * size), size);
                    pos++;
                }
            }

            for (; i < pivot; i+= size)
            {
                // During the second half, count equal values as above the pivot
                if (comparer(context, base + i, base + pivot) < 0)
                {
                    CCQ_SWAP(base + i, base + (pos * size), size);
                    pos++;
                }
            }

            // issue the last change
            CCQ_SWAP(base + (pos * size), base + pivot, size);

            Sort(base, pos++, size, comparer, context);
            Sort(base + (pos * size), nmemb - pos, size, comparer, context);
        }